

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.h
# Opt level: O1

void bcf_enc_size(kstring_t *s,int size,int type)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  int32_t x;
  size_t sVar4;
  
  if (size < 0xf) {
    uVar1 = s->l + 1;
    if (s->m <= uVar1) {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      s->s = pcVar2;
    }
    size = size << 4 | type;
  }
  else {
    uVar1 = s->l + 1;
    if (uVar1 < s->m) {
LAB_0011be4d:
      sVar3 = s->l;
      s->l = sVar3 + 1;
      s->s[sVar3] = (byte)type | 0xf0;
      s->s[s->l] = '\0';
    }
    else {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 != (char *)0x0) {
        s->s = pcVar2;
        goto LAB_0011be4d;
      }
    }
    if (0x7f < size) {
      if (size < 0x8000) {
        uVar1 = s->l + 1;
        if (uVar1 < s->m) {
LAB_0011c110:
          sVar3 = s->l;
          s->l = sVar3 + 1;
          s->s[sVar3] = '\x12';
          s->s[s->l] = '\0';
        }
        else {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 != (char *)0x0) {
            s->s = pcVar2;
            goto LAB_0011c110;
          }
        }
        uVar1 = s->l + 3;
        if (s->m <= uVar1) {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 == (char *)0x0) {
            return;
          }
          s->s = pcVar2;
        }
        *(short *)(s->s + s->l) = (short)size;
        sVar3 = s->l + 2;
      }
      else {
        uVar1 = s->l + 1;
        if (uVar1 < s->m) {
LAB_0011bedc:
          sVar3 = s->l;
          s->l = sVar3 + 1;
          s->s[sVar3] = '\x13';
          s->s[s->l] = '\0';
        }
        else {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 != (char *)0x0) {
            s->s = pcVar2;
            goto LAB_0011bedc;
          }
        }
        uVar1 = s->l + 5;
        if (s->m <= uVar1) {
          uVar1 = uVar1 >> 1 | uVar1;
          uVar1 = uVar1 >> 2 | uVar1;
          uVar1 = uVar1 >> 4 | uVar1;
          uVar1 = uVar1 >> 8 | uVar1;
          sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
          s->m = sVar4;
          pcVar2 = (char *)realloc(s->s,sVar4);
          if (pcVar2 == (char *)0x0) {
            return;
          }
          s->s = pcVar2;
        }
        *(int *)(s->s + s->l) = size;
        sVar3 = s->l + 4;
      }
      s->l = sVar3;
      pcVar2 = s->s + sVar3;
      goto LAB_0011c19d;
    }
    uVar1 = s->l + 1;
    if (uVar1 < s->m) {
LAB_0011c025:
      sVar3 = s->l;
      s->l = sVar3 + 1;
      s->s[sVar3] = '\x11';
      s->s[s->l] = '\0';
    }
    else {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 != (char *)0x0) {
        s->s = pcVar2;
        goto LAB_0011c025;
      }
    }
    uVar1 = s->l + 1;
    if (s->m <= uVar1) {
      uVar1 = uVar1 >> 1 | uVar1;
      uVar1 = uVar1 >> 2 | uVar1;
      uVar1 = uVar1 >> 4 | uVar1;
      uVar1 = uVar1 >> 8 | uVar1;
      sVar4 = (uVar1 >> 0x10 | uVar1) + 1;
      s->m = sVar4;
      pcVar2 = (char *)realloc(s->s,sVar4);
      if (pcVar2 == (char *)0x0) {
        return;
      }
      s->s = pcVar2;
    }
  }
  sVar3 = s->l;
  s->l = sVar3 + 1;
  s->s[sVar3] = (char)size;
  pcVar2 = s->s + s->l;
LAB_0011c19d:
  *pcVar2 = '\0';
  return;
}

Assistant:

static inline void bcf_enc_size(kstring_t *s, int size, int type)
{
    if (size >= 15) {
        kputc(15<<4|type, s);
        if (size >= 128) {
            if (size >= 32768) {
                int32_t x = size;
                kputc(1<<4|BCF_BT_INT32, s);
                kputsn((char*)&x, 4, s);
            } else {
                int16_t x = size;
                kputc(1<<4|BCF_BT_INT16, s);
                kputsn((char*)&x, 2, s);
            }
        } else {
            kputc(1<<4|BCF_BT_INT8, s);
            kputc(size, s);
        }
    } else kputc(size<<4|type, s);
}